

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BilinearPatch::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BilinearPatch *this,Ray *ray,
          Float tMax)

{
  ulong uVar1;
  BilinearPatchMesh *mesh;
  int *piVar2;
  Point3f *pPVar3;
  long lVar4;
  undefined1 auVar5 [16];
  optional<pbrt::BilinearIntersection> blpIsect;
  SurfaceInteraction intr;
  undefined1 local_140 [40];
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  lVar4 = (long)this->blpIndex;
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  piVar2 = mesh->vertexIndices;
  pPVar3 = mesh->p;
  IntersectBilinearPatch
            ((Ray *)local_140,tMax,&ray->o,pPVar3 + piVar2[lVar4 * 4],pPVar3 + piVar2[lVar4 * 4 + 1]
             ,pPVar3 + piVar2[lVar4 * 4 + 2]);
  if (local_140[0xc] == '\0') {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    uVar1._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar5._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar5._8_4_ = 0x80000000;
    auVar5._12_4_ = 0x80000000;
    local_140._24_4_ = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    local_140._16_8_ = vmovlps_avx(auVar5);
    InteractionFromIntersection
              ((SurfaceInteraction *)(local_140 + 0x20),mesh,this->blpIndex,(Point2f *)local_140,
               ray->time,(Vector3f *)(local_140 + 0x10));
    if (local_140[0xc] == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
    }
    __return_storage_ptr__->set = true;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_e0;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)local_140._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = uStack_118;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uStack_110;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = uStack_108;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = uStack_100;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uStack_f8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uStack_f0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = uStack_e8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_d8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = local_d0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = uStack_c8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = uStack_c0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = uStack_b8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = uStack_b0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = uStack_a8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = uStack_a0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = uStack_98;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = uStack_a0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = uStack_98;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = uStack_90;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = uStack_88;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = uStack_80;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = uStack_78;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = uStack_70;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = uStack_68;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_60;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = uStack_58;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_30;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = local_50;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = uStack_48;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = uStack_40;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = uStack_38;
    *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_140._8_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> BilinearPatch::Intersect(const Ray &ray,
                                                           Float tMax) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    pstd::optional<BilinearIntersection> blpIsect =
        IntersectBilinearPatch(ray, tMax, p00, p10, p01, p11);
    if (!blpIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, blpIndex, blpIsect->uv, ray.time, -ray.d);
    return ShapeIntersection{intr, blpIsect->t};
}